

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O3

void __thiscall groundupdbext::MemoryKeyValueStore::clear(MemoryKeyValueStore *this)

{
  Impl *pIVar1;
  
  std::
  _Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(this->mImpl)._M_t.
             super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
             .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>._M_head_impl)
  ;
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::MemoryKeyValueStore::Impl_*,_false>._M_head_impl;
  if (*(bool *)((long)&(pIVar1->m_cachedStore).
                       super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
               + 8) == true) {
    (**(code **)(**(long **)&(pIVar1->m_cachedStore).
                             super__Optional_base<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>,_false,_false>
                             ._M_payload + 0x38))();
    return;
  }
  return;
}

Assistant:

void
MemoryKeyValueStore::clear()
{
  mImpl->m_keyValueStore.clear();
  if (mImpl->m_cachedStore) {
    mImpl->m_cachedStore->get()->clear();
  }
}